

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

void build_node(XML_Parser parser,int src_node,XML_Content *dest,XML_Content **contpos,
               XML_Char **strpos)

{
  char cVar1;
  XML_Content_Type XVar2;
  uint uVar3;
  int src_node_00;
  DTD *pDVar4;
  CONTENT_SCAFFOLD *pCVar5;
  char *pcVar6;
  char *pcVar7;
  int *piVar8;
  long lVar9;
  ulong uVar10;
  
  pDVar4 = parser->m_dtd;
  pCVar5 = pDVar4->scaffold;
  XVar2 = pCVar5[src_node].type;
  dest->type = XVar2;
  dest->quant = pCVar5[src_node].quant;
  if (XVar2 == XML_CTYPE_NAME) {
    dest->name = *strpos;
    pcVar7 = pCVar5[src_node].name;
    do {
      cVar1 = *pcVar7;
      pcVar6 = *strpos;
      *strpos = pcVar6 + 1;
      *pcVar6 = cVar1;
      cVar1 = *pcVar7;
      pcVar7 = pcVar7 + 1;
    } while (cVar1 != '\0');
    dest->numchildren = 0;
    lVar9 = 0x18;
  }
  else {
    uVar3 = pCVar5[src_node].childcnt;
    dest->numchildren = uVar3;
    dest->children = *contpos;
    *contpos = *contpos + uVar3;
    lVar9 = 8;
    if (dest->numchildren != 0) {
      piVar8 = &pDVar4->scaffold[src_node].firstchild;
      lVar9 = 0;
      uVar10 = 0;
      do {
        src_node_00 = *piVar8;
        build_node(parser,src_node_00,(XML_Content *)((long)&dest->children->type + lVar9),contpos,
                   strpos);
        uVar10 = uVar10 + 1;
        piVar8 = &pDVar4->scaffold[src_node_00].nextsib;
        lVar9 = lVar9 + 0x20;
      } while (uVar10 < dest->numchildren);
      lVar9 = 8;
    }
  }
  *(undefined8 *)((long)&dest->type + lVar9) = 0;
  return;
}

Assistant:

static void
build_node(XML_Parser parser,
           int src_node,
           XML_Content *dest,
           XML_Content **contpos,
           XML_Char **strpos)
{
  DTD * const dtd = _dtd;  /* save one level of indirection */
  dest->type = dtd->scaffold[src_node].type;
  dest->quant = dtd->scaffold[src_node].quant;
  if (dest->type == XML_CTYPE_NAME) {
    const XML_Char *src;
    dest->name = *strpos;
    src = dtd->scaffold[src_node].name;
    for (;;) {
      *(*strpos)++ = *src;
      if (!*src)
        break;
      src++;
    }
    dest->numchildren = 0;
    dest->children = NULL;
  }
  else {
    unsigned int i;
    int cn;
    dest->numchildren = dtd->scaffold[src_node].childcnt;
    dest->children = *contpos;
    *contpos += dest->numchildren;
    for (i = 0, cn = dtd->scaffold[src_node].firstchild;
         i < dest->numchildren;
         i++, cn = dtd->scaffold[cn].nextsib) {
      build_node(parser, cn, &(dest->children[i]), contpos, strpos);
    }
    dest->name = NULL;
  }
}